

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_TweakPrivkeySecp256k1EcTest_Test::TestBody
          (Secp256k1_TweakPrivkeySecp256k1EcTest_Test *this)

{
  pointer paVar1;
  bool bVar2;
  secp256k1_context_struct *context;
  char *pcVar3;
  pointer paVar4;
  AssertionResult gtest_ar_1;
  Secp256k1 secp;
  ByteData actual_mul;
  AssertHelper local_e0;
  string local_d8;
  ByteData actual_add;
  TweakPrivkeyTestVector test_vector;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&secp,context);
  paVar1 = tweak_privkey_test_vectors.
           super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar4 = tweak_privkey_test_vectors.
                super__Vector_base<TweakPrivkeyTestVector,_std::allocator<TweakPrivkeyTestVector>_>.
                _M_impl.super__Vector_impl_data._M_start; paVar4 != paVar1; paVar4 = paVar4 + 1) {
    anon_struct_112_4_5aca4469::TweakPrivkeyTestVector(&test_vector,paVar4);
    cfd::core::ByteData::ByteData(&actual_add);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::Secp256k1::AddTweakPrivkeySecp256k1Ec
                  ((ByteData *)&local_d8,&secp,&test_vector.privkey,&test_vector.tweak);
        cfd::core::ByteData::operator=(&actual_add,(ByteData *)&local_d8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
      }
    }
    else {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&actual_mul,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x15e,
                 "Expected: actual_add = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&actual_mul,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&actual_mul);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_d8);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_d8,&actual_add);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&actual_mul,"test_vector.expect_add","actual_add.GetHex()",
               &test_vector.expect_add,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if ((char)actual_mul.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&local_d8);
      pcVar3 = "";
      if (actual_mul.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish != (pointer)0x0) {
        pcVar3 = *(char **)actual_mul.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x15f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&actual_mul.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    cfd::core::ByteData::ByteData(&actual_mul);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::Secp256k1::MulTweakPrivkeySecp256k1Ec
                  ((ByteData *)&local_d8,&secp,&test_vector.privkey,&test_vector.tweak);
        cfd::core::ByteData::operator=(&actual_mul,(ByteData *)&local_d8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
      }
    }
    else {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x164,
                 "Expected: actual_mul = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey, test_vector.tweak) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_d8);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_d8,&actual_mul);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"test_vector.expect_mul","actual_mul.GetHex()",
               &test_vector.expect_mul,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_d8);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x165,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual_mul);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual_add);
    anon_struct_112_4_5aca4469::~TweakPrivkeyTestVector(&test_vector);
  }
  return;
}

Assistant:

TEST(Secp256k1, TweakPrivkeySecp256k1EcTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPrivkeyTestVector test_vector : tweak_privkey_test_vectors) {
    ByteData actual_add;
    EXPECT_NO_THROW(
        actual_add = secp.AddTweakPrivkeySecp256k1Ec(test_vector.privkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_add, actual_add.GetHex());

    ByteData actual_mul;
    EXPECT_NO_THROW(
        actual_mul = secp.MulTweakPrivkeySecp256k1Ec(test_vector.privkey,
            test_vector.tweak));
    EXPECT_EQ(test_vector.expect_mul, actual_mul.GetHex());
  }
}